

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

int __thiscall nuraft::asio_rpc_listener::shutdown(asio_rpc_listener *this,int __fd,int __how)

{
  pointer psVar1;
  rpc_session *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  pointer psVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->session_lock_);
  if (iVar3 == 0) {
    psVar1 = (this->active_sessions_).
             super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (this->active_sessions_).
                  super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      this_00 = (psVar4->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var2 = (psVar4->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      rpc_session::stop(this_00);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    std::
    vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
    ::clear(&this->active_sessions_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->session_lock_);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->listener_lock_);
    if (iVar3 == 0) {
      p_Var2 = (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->listener_lock_);
      return iVar3;
    }
  }
  std::__throw_system_error(iVar3);
}

Assistant:

virtual void shutdown() override {
        {
            auto_lock(session_lock_);
            for (auto& entry: active_sessions_) {
                ptr<rpc_session> s = entry;
                s->stop();
                s.reset();
            }
            active_sessions_.clear();
        }

        auto_lock(listener_lock_);
        handler_.reset();
    }